

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotation_t *
opengv::relative_pose::twopt_rotationOnly(RelativeAdapterBase *adapter,size_t index0,size_t index1)

{
  TransposeReturnType this;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  PVar1;
  Vector3d fprime;
  Vector3d f;
  MatrixXd *in_stack_000001c8;
  MatrixXd Hcross;
  Vector3d pointsCenter2;
  Vector3d pointsCenter1;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *in_stack_fffffffffffffcd8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffce0;
  int *in_stack_fffffffffffffcf0;
  int *in_stack_fffffffffffffcf8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  double *scalar;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  undefined1 local_278 [48];
  undefined1 local_248 [48];
  non_const_type local_218;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_210;
  undefined1 local_200 [72];
  undefined1 local_1b8 [104];
  undefined4 local_150;
  undefined4 local_14c;
  undefined8 local_130;
  undefined8 local_108;
  undefined1 local_e0 [24];
  undefined1 local_c8 [72];
  double local_80 [3];
  undefined1 local_68 [24];
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_50 [48];
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_68,in_RSI,in_RDX);
  scalar = local_80;
  (**(code **)(*local_10 + 0x10))(scalar,local_10,local_20);
  this_01 = local_50;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+(this_00,in_stack_fffffffffffffd00);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffcd8);
  (**(code **)(*local_10 + 0x18))(local_c8,local_10,local_18);
  (**(code **)(*local_10 + 0x18))(local_e0,local_10,local_20);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+(this_00,in_stack_fffffffffffffd00);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffcd8);
  local_108 = 0x4008000000000000;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(this_01,scalar);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffcd8);
  local_130 = 0x4008000000000000;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(this_01,scalar);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffcd8);
  local_14c = 3;
  local_150 = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffce0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffffcd8);
  (**(code **)(*local_10 + 0x10))(local_1b8,local_10,local_18);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this_00,in_stack_fffffffffffffd00);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffcd8);
  (**(code **)(*local_10 + 0x18))(local_200,local_10,local_18);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this_00,in_stack_fffffffffffffd00);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffcd8);
  this = Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                   ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffcd8);
  local_218 = (non_const_type)this;
  PVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  local_210 = PVar1;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this.m_matrix,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
              *)PVar1.m_lhs);
  (**(code **)(*local_10 + 0x10))(local_248,local_10,local_20);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (this_00,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this.m_matrix);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffcd8);
  (**(code **)(*local_10 + 0x18))(local_278,local_10,local_20);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (this_00,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this.m_matrix);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffcd8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffcd8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this.m_matrix,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
              *)PVar1.m_lhs);
  math::arun(in_stack_000001c8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xb8eba9);
  return (rotation_t *)in_RDI;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::twopt_rotationOnly(
    const RelativeAdapterBase & adapter,
    size_t index0,
    size_t index1)
{
  Eigen::Vector3d pointsCenter1 =
      adapter.getBearingVector1(index0) + adapter.getBearingVector1(index1);
  Eigen::Vector3d pointsCenter2 =
      adapter.getBearingVector2(index0) + adapter.getBearingVector2(index1);
  pointsCenter1 = pointsCenter1/3.0;
  pointsCenter2 = pointsCenter2/3.0;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  Eigen::Vector3d f = adapter.getBearingVector1(index0) - pointsCenter1;
  Eigen::Vector3d fprime = adapter.getBearingVector2(index0) - pointsCenter2;
  Hcross += fprime * f.transpose();
  f = adapter.getBearingVector1(index1) - pointsCenter1;
  fprime = adapter.getBearingVector2(index1) - pointsCenter2;
  Hcross += fprime * f.transpose();

  return math::arun(Hcross);
}